

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_sse4.c
# Opt level: O2

void aom_compute_flow_at_point_sse4_1
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  int iVar9;
  undefined1 (*pauVar10) [16];
  int iVar11;
  undefined1 in_XMM0 [16];
  undefined1 auVar12 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar21;
  double dVar22;
  short sVar27;
  short sVar28;
  short sVar30;
  short sVar31;
  short sVar32;
  undefined1 auVar23 [16];
  short sVar29;
  short sVar33;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  short sVar37;
  short sVar38;
  undefined4 uVar39;
  double dVar40;
  short sVar47;
  short sVar52;
  undefined4 uVar54;
  short sVar58;
  undefined1 auVar41 [16];
  short sVar45;
  short sVar46;
  short sVar48;
  short sVar50;
  short sVar51;
  short sVar53;
  short sVar56;
  short sVar57;
  short sVar59;
  short sVar61;
  short sVar62;
  undefined1 auVar42 [16];
  double dVar55;
  undefined1 auVar43 [16];
  undefined4 uVar49;
  undefined4 uVar60;
  undefined1 auVar44 [16];
  double dVar63;
  undefined1 auVar64 [16];
  double dVar70;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  double dVar77;
  double dVar79;
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM11 [16];
  undefined1 in_XMM14 [16];
  int16_t dy [64];
  int16_t dx [64];
  undefined1 auStack_1e8 [16];
  undefined2 auStack_1d8 [8];
  undefined1 auStack_1c8 [16];
  undefined2 auStack_1b8 [64];
  short asStack_138 [64];
  short asStack_b8 [68];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar67 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  
  auVar2 = _DAT_004693e0;
  auVar1 = _DAT_00468b50;
  uVar3 = (ulong)stride;
  lVar5 = (long)(stride * y + x);
  auVar42 = *(undefined1 (*) [16])(src + ~uVar3 + lVar5);
  auVar12 = pmovzxbw(in_XMM0,auVar42);
  auVar23 = pmovzxbw(auVar42 >> 8,auVar42 >> 8);
  auVar35 = pmovzxbw(auVar42 >> 0x10,auVar42 >> 0x10);
  auVar24._0_2_ = auVar12._0_2_ - auVar35._0_2_;
  auVar24._2_2_ = auVar12._2_2_ - auVar35._2_2_;
  auVar24._4_2_ = auVar12._4_2_ - auVar35._4_2_;
  auVar24._6_2_ = auVar12._6_2_ - auVar35._6_2_;
  auVar24._8_2_ = auVar12._8_2_ - auVar35._8_2_;
  auVar24._10_2_ = auVar12._10_2_ - auVar35._10_2_;
  auVar24._12_2_ = auVar12._12_2_ - auVar35._12_2_;
  auVar24._14_2_ = auVar12._14_2_ - auVar35._14_2_;
  auVar42 = *(undefined1 (*) [16])(src + lVar5 + -1);
  auVar36 = pmovzxbw(auVar35,auVar42);
  auVar41 = pmovzxbw(auVar42 >> 8,auVar42 >> 8);
  auVar64 = pmovzxbw(auVar42 >> 0x10,auVar42 >> 0x10);
  auVar42._0_2_ = auVar36._0_2_ - auVar64._0_2_;
  auVar42._2_2_ = auVar36._2_2_ - auVar64._2_2_;
  auVar42._4_2_ = auVar36._4_2_ - auVar64._4_2_;
  auVar42._6_2_ = auVar36._6_2_ - auVar64._6_2_;
  auVar42._8_2_ = auVar36._8_2_ - auVar64._8_2_;
  auVar42._10_2_ = auVar36._10_2_ - auVar64._10_2_;
  auVar42._12_2_ = auVar36._12_2_ - auVar64._12_2_;
  auVar42._14_2_ = auVar36._14_2_ - auVar64._14_2_;
  pauVar10 = (undefined1 (*) [16])(src + (long)(stride * y) + uVar3 + (long)x + -1);
  sVar21 = auVar23._0_2_ * 2 + auVar12._0_2_ + auVar35._0_2_;
  sVar27 = auVar23._2_2_ * 2 + auVar12._2_2_ + auVar35._2_2_;
  sVar28 = auVar23._4_2_ * 2 + auVar12._4_2_ + auVar35._4_2_;
  sVar29 = auVar23._6_2_ * 2 + auVar12._6_2_ + auVar35._6_2_;
  sVar30 = auVar23._8_2_ * 2 + auVar12._8_2_ + auVar35._8_2_;
  sVar31 = auVar23._10_2_ * 2 + auVar12._10_2_ + auVar35._10_2_;
  sVar32 = auVar23._12_2_ * 2 + auVar12._12_2_ + auVar35._12_2_;
  sVar33 = auVar23._14_2_ * 2 + auVar12._14_2_ + auVar35._14_2_;
  sVar37 = auVar41._0_2_ * 2 + auVar36._0_2_ + auVar64._0_2_;
  sVar45 = auVar41._2_2_ * 2 + auVar36._2_2_ + auVar64._2_2_;
  sVar47 = auVar41._4_2_ * 2 + auVar36._4_2_ + auVar64._4_2_;
  sVar50 = auVar41._6_2_ * 2 + auVar36._6_2_ + auVar64._6_2_;
  sVar52 = auVar41._8_2_ * 2 + auVar36._8_2_ + auVar64._8_2_;
  sVar56 = auVar41._10_2_ * 2 + auVar36._10_2_ + auVar64._10_2_;
  sVar58 = auVar41._12_2_ * 2 + auVar36._12_2_ + auVar64._12_2_;
  sVar61 = auVar41._14_2_ * 2 + auVar36._14_2_ + auVar64._14_2_;
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x10) {
    auVar12 = *pauVar10;
    auVar23 = pmovzxbw(auVar42,auVar12);
    auVar35 = pmovzxbw(auVar12 >> 8,auVar12 >> 8);
    auVar36 = pmovzxbw(auVar12 >> 0x10,auVar12 >> 0x10);
    sVar38 = auVar35._0_2_ * 2 + auVar23._0_2_ + auVar36._0_2_;
    sVar46 = auVar35._2_2_ * 2 + auVar23._2_2_ + auVar36._2_2_;
    sVar48 = auVar35._4_2_ * 2 + auVar23._4_2_ + auVar36._4_2_;
    sVar51 = auVar35._6_2_ * 2 + auVar23._6_2_ + auVar36._6_2_;
    sVar53 = auVar35._8_2_ * 2 + auVar23._8_2_ + auVar36._8_2_;
    sVar57 = auVar35._10_2_ * 2 + auVar23._10_2_ + auVar36._10_2_;
    sVar59 = auVar35._12_2_ * 2 + auVar23._12_2_ + auVar36._12_2_;
    sVar62 = auVar35._14_2_ * 2 + auVar23._14_2_ + auVar36._14_2_;
    auVar12._0_2_ = auVar23._0_2_ - auVar36._0_2_;
    auVar12._2_2_ = auVar23._2_2_ - auVar36._2_2_;
    auVar12._4_2_ = auVar23._4_2_ - auVar36._4_2_;
    auVar12._6_2_ = auVar23._6_2_ - auVar36._6_2_;
    auVar12._8_2_ = auVar23._8_2_ - auVar36._8_2_;
    auVar12._10_2_ = auVar23._10_2_ - auVar36._10_2_;
    auVar12._12_2_ = auVar23._12_2_ - auVar36._12_2_;
    auVar12._14_2_ = auVar23._14_2_ - auVar36._14_2_;
    *(short *)((long)asStack_b8 + lVar5) = auVar24._0_2_ + auVar42._0_2_ * 2 + auVar12._0_2_;
    *(short *)((long)asStack_b8 + lVar5 + 2) = auVar24._2_2_ + auVar42._2_2_ * 2 + auVar12._2_2_;
    *(short *)((long)asStack_b8 + lVar5 + 4) = auVar24._4_2_ + auVar42._4_2_ * 2 + auVar12._4_2_;
    *(short *)((long)asStack_b8 + lVar5 + 6) = auVar24._6_2_ + auVar42._6_2_ * 2 + auVar12._6_2_;
    *(short *)((long)asStack_b8 + lVar5 + 8) = auVar24._8_2_ + auVar42._8_2_ * 2 + auVar12._8_2_;
    *(short *)((long)asStack_b8 + lVar5 + 10) = auVar24._10_2_ + auVar42._10_2_ * 2 + auVar12._10_2_
    ;
    *(short *)((long)asStack_b8 + lVar5 + 0xc) =
         auVar24._12_2_ + auVar42._12_2_ * 2 + auVar12._12_2_;
    *(short *)((long)asStack_b8 + lVar5 + 0xe) =
         auVar24._14_2_ + auVar42._14_2_ * 2 + auVar12._14_2_;
    *(short *)((long)asStack_138 + lVar5) = sVar21 - sVar38;
    *(short *)((long)asStack_138 + lVar5 + 2) = sVar27 - sVar46;
    *(short *)((long)asStack_138 + lVar5 + 4) = sVar28 - sVar48;
    *(short *)((long)asStack_138 + lVar5 + 6) = sVar29 - sVar51;
    *(short *)((long)asStack_138 + lVar5 + 8) = sVar30 - sVar53;
    *(short *)((long)asStack_138 + lVar5 + 10) = sVar31 - sVar57;
    *(short *)((long)asStack_138 + lVar5 + 0xc) = sVar32 - sVar59;
    *(short *)((long)asStack_138 + lVar5 + 0xe) = sVar33 - sVar62;
    pauVar10 = (undefined1 (*) [16])(*pauVar10 + uVar3);
    auVar24 = auVar42;
    auVar42 = auVar12;
    sVar21 = sVar37;
    sVar27 = sVar45;
    sVar28 = sVar47;
    sVar29 = sVar50;
    sVar30 = sVar52;
    sVar31 = sVar56;
    sVar32 = sVar58;
    sVar33 = sVar61;
    sVar37 = sVar38;
    sVar45 = sVar46;
    sVar47 = sVar48;
    sVar50 = sVar51;
    sVar52 = sVar53;
    sVar56 = sVar57;
    sVar58 = sVar59;
    sVar61 = sVar62;
  }
  auVar42 = (undefined1  [16])0x0;
  auVar24 = (undefined1  [16])0x0;
  auVar12 = (undefined1  [16])0x0;
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x10) {
    auVar23 = *(undefined1 (*) [16])((long)asStack_b8 + lVar5);
    auVar35 = *(undefined1 (*) [16])((long)asStack_138 + lVar5);
    auVar41 = pmaddwd(auVar23,auVar23);
    auVar36._0_4_ = auVar42._0_4_ + auVar41._0_4_;
    auVar36._4_4_ = auVar42._4_4_ + auVar41._4_4_;
    auVar36._8_4_ = auVar42._8_4_ + auVar41._8_4_;
    auVar36._12_4_ = auVar42._12_4_ + auVar41._12_4_;
    auVar42 = pmaddwd(auVar23,auVar35);
    auVar23._0_4_ = auVar24._0_4_ + auVar42._0_4_;
    auVar23._4_4_ = auVar24._4_4_ + auVar42._4_4_;
    auVar23._8_4_ = auVar24._8_4_ + auVar42._8_4_;
    auVar23._12_4_ = auVar24._12_4_ + auVar42._12_4_;
    auVar42 = pmaddwd(auVar35,auVar35);
    auVar35._0_4_ = auVar12._0_4_ + auVar42._0_4_;
    auVar35._4_4_ = auVar12._4_4_ + auVar42._4_4_;
    auVar35._8_4_ = auVar12._8_4_ + auVar42._8_4_;
    auVar35._12_4_ = auVar12._12_4_ + auVar42._12_4_;
    auVar42 = auVar36;
    auVar24 = auVar23;
    auVar12 = auVar35;
  }
  auVar42 = phaddd(auVar42,auVar24);
  auVar24 = phaddd(auVar24,auVar12);
  auVar42 = phaddd(auVar42,auVar24);
  dVar34 = (double)(auVar42._0_4_ + 1);
  dVar19 = (double)(auVar42._12_4_ + 1);
  dVar71 = 1.0 / (dVar19 * dVar34 - (double)auVar42._8_4_ * (double)auVar42._4_4_);
  auVar41._0_8_ = -(double)auVar42._8_4_;
  auVar41._8_8_ = -dVar19;
  dVar20 = auVar41._0_8_ * dVar71;
  iVar4 = 0;
  auVar24 = pmovsxbw(in_XMM11,0x100010001000100);
  auVar12 = pmovzxbd(in_XMM14,0x80808080);
  do {
    if (iVar4 == 4) {
      return;
    }
    dVar22 = *u;
    auVar76._8_8_ = *v;
    auVar76._0_8_ = dVar22;
    auVar35 = roundpd(auVar41,auVar76,9);
    dVar40 = dVar22 - auVar35._0_8_;
    dVar55 = *v - auVar35._8_8_;
    dVar77 = dVar40 * dVar40;
    dVar79 = dVar55 * dVar55;
    dVar63 = dVar40 * dVar77 * 0.5;
    dVar70 = dVar55 * dVar79 * 0.5;
    auVar81._0_8_ = dVar40 * dVar77 * 1.5;
    auVar81._8_8_ = dVar55 * dVar79 * 1.5;
    auVar78._0_8_ = dVar77 * 0.5;
    auVar78._8_8_ = dVar79 * 0.5;
    auVar64._0_8_ = ((dVar77 - dVar40 * 0.5) - dVar63) * 16384.0;
    auVar64._8_8_ = ((dVar79 - dVar55 * 0.5) - dVar70) * 16384.0;
    auVar23 = roundpd(auVar64,auVar64,8);
    auVar72._0_8_ = (dVar77 * -2.5 + 1.0 + auVar81._0_8_) * 16384.0;
    auVar72._8_8_ = (dVar79 * -2.5 + 1.0 + auVar81._8_8_) * 16384.0;
    auVar36 = roundpd(auVar72,auVar72,8);
    auVar83._0_8_ = ((dVar77 + dVar77 + dVar40 * 0.5) - auVar81._0_8_) * 16384.0;
    auVar83._8_8_ = ((dVar79 + dVar79 + dVar55 * 0.5) - auVar81._8_8_) * 16384.0;
    auVar41 = roundpd(auVar78,auVar83,8);
    auVar65._0_8_ = (dVar63 - auVar78._0_8_) * 16384.0;
    auVar65._8_8_ = (dVar70 - auVar78._8_8_) * 16384.0;
    auVar43._0_4_ = (int)auVar23._0_8_;
    auVar88._4_4_ = (int)auVar23._8_8_;
    auVar88._0_4_ = auVar43._0_4_;
    auVar23 = roundpd(auVar23,auVar65,8);
    auVar88._8_4_ = auVar88._4_4_;
    auVar88._12_4_ = (int)auVar36._8_8_;
    auVar43._8_8_ = auVar88._8_8_;
    auVar43._4_4_ = (int)auVar36._0_8_;
    auVar66._0_4_ = (int)auVar41._0_8_;
    auVar67._4_4_ = (int)auVar41._8_8_;
    auVar67._0_4_ = auVar66._0_4_;
    auVar67._8_4_ = auVar67._4_4_;
    auVar67._12_4_ = (int)auVar23._8_8_;
    auVar66._8_8_ = auVar67._8_8_;
    auVar66._4_4_ = (int)auVar23._0_8_;
    iVar11 = (int)auVar35._0_8_ + x;
    iVar9 = width;
    if (iVar11 < width) {
      iVar9 = iVar11;
    }
    iVar9 = iVar9 + -1;
    iVar7 = (int)auVar35._8_8_ + y;
    iVar6 = height;
    if (iVar7 < height) {
      iVar6 = iVar7;
    }
    auVar23 = packssdw(auVar43,auVar66);
    if (iVar7 < -9) {
      iVar6 = -9;
    }
    if (iVar11 < -9) {
      iVar9 = -10;
    }
    uVar39 = auVar23._0_4_;
    uVar49 = auVar23._4_4_;
    uVar54 = auVar23._8_4_;
    uVar60 = auVar23._12_4_;
    auVar68._4_4_ = uVar39;
    auVar68._0_4_ = uVar39;
    auVar68._8_4_ = uVar39;
    auVar68._12_4_ = uVar39;
    auVar73._4_4_ = uVar54;
    auVar73._0_4_ = uVar54;
    auVar73._8_4_ = uVar54;
    auVar73._12_4_ = uVar54;
    pauVar10 = (undefined1 (*) [16])(ref + ((long)iVar6 + -1) * uVar3 + (long)iVar9);
    for (lVar5 = 0; lVar5 != 0xb0; lVar5 = lVar5 + 0x10) {
      auVar23 = *pauVar10;
      auVar36 = pmovzxbw(auVar81,auVar23);
      auVar13._8_4_ = auVar23._8_4_;
      auVar13._12_4_ = auVar23._12_4_;
      auVar13._0_8_ = auVar23._4_8_;
      auVar23 = pmovzxbw(auVar13,auVar13);
      auVar35 = pshufb(auVar36,auVar1);
      auVar36 = pshufb(auVar36,auVar2);
      auVar35 = pmaddwd(auVar35,auVar68);
      auVar36 = pmaddwd(auVar36,auVar73);
      auVar80._0_4_ = auVar36._0_4_ + auVar35._0_4_ + auVar12._0_4_ >> 8;
      auVar80._4_4_ = auVar36._4_4_ + auVar35._4_4_ + auVar12._4_4_ >> 8;
      auVar80._8_4_ = auVar36._8_4_ + auVar35._8_4_ + auVar12._8_4_ >> 8;
      auVar80._12_4_ = auVar36._12_4_ + auVar35._12_4_ + auVar12._12_4_ >> 8;
      auVar35 = pshufb(auVar23,auVar1);
      auVar23 = pshufb(auVar23,auVar2);
      auVar35 = pmaddwd(auVar35,auVar68);
      auVar23 = pmaddwd(auVar23,auVar73);
      auVar14._0_4_ = auVar23._0_4_ + auVar35._0_4_ + auVar12._0_4_ >> 8;
      auVar14._4_4_ = auVar23._4_4_ + auVar35._4_4_ + auVar12._4_4_ >> 8;
      auVar14._8_4_ = auVar23._8_4_ + auVar35._8_4_ + auVar12._8_4_ >> 8;
      auVar14._12_4_ = auVar23._12_4_ + auVar35._12_4_ + auVar12._12_4_ >> 8;
      auVar81 = packssdw(auVar80,auVar14);
      *(undefined1 (*) [16])(auStack_1e8 + lVar5) = auVar81;
      pauVar10 = (undefined1 (*) [16])(*pauVar10 + uVar3);
    }
    auVar69._4_4_ = uVar49;
    auVar69._0_4_ = uVar49;
    auVar69._8_4_ = uVar49;
    auVar69._12_4_ = uVar49;
    auVar82._4_4_ = uVar60;
    auVar82._0_4_ = uVar60;
    auVar82._8_4_ = uVar60;
    auVar82._12_4_ = uVar60;
    puVar8 = src + (long)y * uVar3 + (long)x;
    auVar23 = (undefined1  [16])0x0;
    auVar35 = (undefined1  [16])0x0;
    for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 0x10) {
      auVar36 = *(undefined1 (*) [16])(auStack_1e8 + lVar5);
      auVar41 = *(undefined1 (*) [16])(auStack_1c8 + lVar5);
      auVar18._0_12_ = auVar36._0_12_;
      auVar18._12_2_ = auVar36._6_2_;
      auVar18._14_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 6);
      auVar17._12_4_ = auVar18._12_4_;
      auVar17._0_10_ = auVar36._0_10_;
      auVar17._10_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 4);
      auVar16._10_6_ = auVar17._10_6_;
      auVar16._0_8_ = auVar36._0_8_;
      auVar16._8_2_ = auVar36._4_2_;
      auVar15._8_8_ = auVar16._8_8_;
      auVar15._6_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 2);
      auVar15._4_2_ = auVar36._2_2_;
      auVar15._0_2_ = auVar36._0_2_;
      auVar15._2_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5);
      auVar64 = pmaddwd(auVar15,auVar69);
      auVar87._0_12_ = auVar41._0_12_;
      auVar87._12_2_ = auVar41._6_2_;
      auVar87._14_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 6);
      auVar86._12_4_ = auVar87._12_4_;
      auVar86._0_10_ = auVar41._0_10_;
      auVar86._10_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 4);
      auVar85._10_6_ = auVar86._10_6_;
      auVar85._0_8_ = auVar41._0_8_;
      auVar85._8_2_ = auVar41._4_2_;
      auVar84._8_8_ = auVar85._8_8_;
      auVar84._6_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 2);
      auVar84._4_2_ = auVar41._2_2_;
      auVar84._0_2_ = auVar41._0_2_;
      auVar84._2_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5);
      auVar88 = pmaddwd(auVar84,auVar82);
      auVar75._2_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 8);
      auVar75._0_2_ = auVar36._8_2_;
      auVar75._4_2_ = auVar36._10_2_;
      auVar75._6_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 10);
      auVar75._8_2_ = auVar36._12_2_;
      auVar75._10_2_ = *(undefined2 *)((long)auStack_1d8 + lVar5 + 0xc);
      auVar75._12_2_ = auVar36._14_2_;
      auVar75._14_2_ = *(undefined2 *)(auStack_1c8 + lVar5 + -2);
      auVar76 = pmaddwd(auVar75,auVar69);
      auVar25._2_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 8);
      auVar25._0_2_ = auVar41._8_2_;
      auVar25._4_2_ = auVar41._10_2_;
      auVar25._6_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 10);
      auVar25._8_2_ = auVar41._12_2_;
      auVar25._10_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 0xc);
      auVar25._12_2_ = auVar41._14_2_;
      auVar25._14_2_ = *(undefined2 *)((long)auStack_1b8 + lVar5 + 0xe);
      auVar36 = pmaddwd(auVar25,auVar82);
      auVar89._0_4_ = auVar88._0_4_ + auVar64._0_4_ + auVar24._0_4_ >> 0x11;
      auVar89._4_4_ = auVar88._4_4_ + auVar64._4_4_ + auVar24._4_4_ >> 0x11;
      auVar89._8_4_ = auVar88._8_4_ + auVar64._8_4_ + auVar24._8_4_ >> 0x11;
      auVar89._12_4_ = auVar88._12_4_ + auVar64._12_4_ + auVar24._12_4_ >> 0x11;
      auVar26._0_4_ = auVar36._0_4_ + auVar76._0_4_ + auVar24._0_4_ >> 0x11;
      auVar26._4_4_ = auVar36._4_4_ + auVar76._4_4_ + auVar24._4_4_ >> 0x11;
      auVar26._8_4_ = auVar36._8_4_ + auVar76._8_4_ + auVar24._8_4_ >> 0x11;
      auVar26._12_4_ = auVar36._12_4_ + auVar76._12_4_ + auVar24._12_4_ >> 0x11;
      auVar41 = packssdw(auVar89,auVar26);
      auVar36 = pmovzxbw(auVar64,*(undefined8 *)puVar8);
      auVar36 = psllw(auVar36,3);
      auVar90._0_2_ = auVar41._0_2_ - auVar36._0_2_;
      auVar90._2_2_ = auVar41._2_2_ - auVar36._2_2_;
      auVar90._4_2_ = auVar41._4_2_ - auVar36._4_2_;
      auVar90._6_2_ = auVar41._6_2_ - auVar36._6_2_;
      auVar90._8_2_ = auVar41._8_2_ - auVar36._8_2_;
      auVar90._10_2_ = auVar41._10_2_ - auVar36._10_2_;
      auVar90._12_2_ = auVar41._12_2_ - auVar36._12_2_;
      auVar90._14_2_ = auVar41._14_2_ - auVar36._14_2_;
      auVar36 = pmaddwd(*(undefined1 (*) [16])((long)asStack_b8 + lVar5),auVar90);
      auVar41 = pmaddwd(auVar90,*(undefined1 (*) [16])((long)asStack_138 + lVar5));
      auVar74._0_4_ = auVar35._0_4_ + auVar36._0_4_;
      auVar74._4_4_ = auVar35._4_4_ + auVar36._4_4_;
      auVar74._8_4_ = auVar35._8_4_ + auVar36._8_4_;
      auVar74._12_4_ = auVar35._12_4_ + auVar36._12_4_;
      auVar44._0_4_ = auVar23._0_4_ + auVar41._0_4_;
      auVar44._4_4_ = auVar23._4_4_ + auVar41._4_4_;
      auVar44._8_4_ = auVar23._8_4_ + auVar41._8_4_;
      auVar44._12_4_ = auVar23._12_4_ + auVar41._12_4_;
      puVar8 = puVar8 + uVar3;
      auVar23 = auVar44;
      auVar35 = auVar74;
    }
    auVar23 = phaddd(auVar35,auVar23);
    auVar23 = phaddd(auVar23,auVar23);
    dVar55 = (double)auVar23._0_4_ * dVar19 * dVar71 +
             (double)auVar23._12_4_ * -(double)auVar42._4_4_ * dVar71;
    dVar63 = (double)auVar23._0_4_ * dVar20 + (double)auVar23._12_4_ * dVar34 * dVar71;
    auVar41 = ZEXT816(0x4000000000000000);
    dVar40 = 2.0;
    if (dVar55 <= 2.0) {
      dVar40 = dVar55;
    }
    *u = dVar22 + (double)(-(ulong)(dVar55 < -2.0) & 0xc000000000000000 |
                          ~-(ulong)(dVar55 < -2.0) & (ulong)dVar40);
    dVar22 = 2.0;
    if (dVar63 <= 2.0) {
      dVar22 = dVar63;
    }
    *v = (double)(-(ulong)(dVar63 < -2.0) & 0xc000000000000000 |
                 ~-(ulong)(dVar63 < -2.0) & (ulong)dVar22) + *v;
    iVar4 = iVar4 + 1;
  } while (0.125 <= ABS(dVar55) + ABS(dVar63));
  return;
}

Assistant:

void aom_compute_flow_at_point_sse4_1(const uint8_t *src, const uint8_t *ref,
                                      int x, int y, int width, int height,
                                      int stride, double *u, double *v) {
  DECLARE_ALIGNED(16, double, M[4]);
  DECLARE_ALIGNED(16, double, M_inv[4]);
  DECLARE_ALIGNED(16, int16_t, dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  DECLARE_ALIGNED(16, int16_t, dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE]);
  int b[2];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, dy);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}